

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::SetItem
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr,DynamicObject *instance,uint32 index,
          Var value,PropertyOperationFlags flags)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  BOOL BVar4;
  IndexPropertyDescriptorMap *this_00;
  void **ppvVar5;
  RecyclableObject *function;
  undefined4 *puVar6;
  RecyclableObject *func;
  IndexPropertyDescriptor *descriptor;
  ScriptContext *scriptContext;
  Var pvStack_38;
  PropertyOperationFlags flags_local;
  Var value_local;
  DynamicObject *pDStack_28;
  uint32 index_local;
  DynamicObject *instance_local;
  ES5Array *arr_local;
  ES5ArrayTypeHandlerBase<int> *this_local;
  
  scriptContext._4_4_ = flags;
  pvStack_38 = value;
  value_local._4_4_ = index;
  pDStack_28 = instance;
  instance_local = (DynamicObject *)arr;
  arr_local = (ES5Array *)this;
  descriptor = (IndexPropertyDescriptor *)
               RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  bVar2 = CanSetItemAt(this,(ES5Array *)instance_local,value_local._4_4_);
  if (bVar2) {
    this_00 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                        (&this->indexPropertyMap);
    bVar2 = IndexPropertyDescriptorMap::TryGetReference
                      (this_00,value_local._4_4_,(IndexPropertyDescriptor **)&func);
    if (bVar2) {
      if (((ulong)(func->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject & 8) == 0) {
        if (((ulong)(func->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject & 4) == 0) {
          this_local._4_4_ = CantAssign(scriptContext._4_4_,(ScriptContext *)descriptor);
        }
        else {
          BVar4 = HasDataItem(this,(ES5Array *)instance_local,value_local._4_4_);
          if (BVar4 == 0) {
            ppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void__
                                ((WriteBarrierPtr *)(func + 1));
            if (*ppvVar5 != (void *)0x0) {
              ppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void__
                                  ((WriteBarrierPtr *)(func + 1));
              function = VarTo<Js::RecyclableObject>(*ppvVar5);
              Js::JavascriptOperators::CallSetter
                        (function,pDStack_28,pvStack_38,(ScriptContext *)0x0);
            }
          }
          else {
            Js::JavascriptArray::DirectSetItemAt<void*>
                      ((JavascriptArray *)instance_local,value_local._4_4_,pvStack_38);
          }
          this_local._4_4_ = 1;
        }
      }
      else {
        bVar3 = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)this);
        if ((bVar3 & 1) == 0) {
          this_local._4_4_ = CantExtend(scriptContext._4_4_,(ScriptContext *)descriptor);
        }
        else {
          bVar2 = DynamicObject::GetHasNoEnumerableProperties(instance_local);
          if (bVar2) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                        ,0x1a9,"(!arr->GetHasNoEnumerableProperties())",
                                        "!arr->GetHasNoEnumerableProperties()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          ppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&func->type)
          ;
          if ((*ppvVar5 != (void *)0x0) ||
             (ppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void__
                                  ((WriteBarrierPtr *)(func + 1)), *ppvVar5 != (void *)0x0)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                        ,0x1ab,"(!descriptor->Getter && !descriptor->Setter)",
                                        "!descriptor->Getter && !descriptor->Setter");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          *(undefined1 *)
           &(func->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject = 7;
          Js::JavascriptArray::DirectSetItemAt<void*>
                    ((JavascriptArray *)instance_local,value_local._4_4_,pvStack_38);
          this_local._4_4_ = 1;
        }
      }
    }
    else {
      bVar3 = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)this);
      if ((bVar3 & 1) == 0) {
        BVar4 = HasDataItem(this,(ES5Array *)instance_local,value_local._4_4_);
        if (BVar4 == 0) {
          BVar4 = CantExtend(scriptContext._4_4_,(ScriptContext *)descriptor);
          return BVar4;
        }
        bVar3 = GetDataItemAttributes(this);
        if ((bVar3 & 4) == 0) {
          BVar4 = CantAssign(scriptContext._4_4_,(ScriptContext *)descriptor);
          return BVar4;
        }
      }
      bVar2 = DynamicObject::GetHasNoEnumerableProperties(instance_local);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                    ,0x1d4,"(!arr->GetHasNoEnumerableProperties())",
                                    "!arr->GetHasNoEnumerableProperties()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      Js::JavascriptArray::DirectSetItemAt<void*>
                ((JavascriptArray *)instance_local,value_local._4_4_,pvStack_38);
      this_local._4_4_ = 1;
    }
  }
  else {
    this_local._4_4_ = CantExtend(scriptContext._4_4_,(ScriptContext *)descriptor);
  }
  return this_local._4_4_;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::SetItem(ES5Array* arr, DynamicObject* instance, uint32 index, Var value, PropertyOperationFlags flags)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();

        // Reject if we need to grow non-writable length
        if (!CanSetItemAt(arr, index))
        {
            return CantExtend(flags, scriptContext);
        }

        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                if (!(this->GetFlags() & this->IsExtensibleFlag))
                {
                    return CantExtend(flags, scriptContext);
                }

                // No need to change hasNoEnumerableProperties. See comment in ES5ArrayTypeHandlerBase<T>::SetItemWithAttributes.
                Assert(!arr->GetHasNoEnumerableProperties());

                Assert(!descriptor->Getter && !descriptor->Setter);
                descriptor->Attributes = PropertyDynamicTypeDefaults;
                arr->DirectSetItemAt(index, value);
                return true;
            }

            if (!(descriptor->Attributes & PropertyWritable))
            {
                return CantAssign(flags, scriptContext);
            }

            if (HasDataItem(arr, index))
            {
                arr->DirectSetItemAt(index, value);
            }
            else if (descriptor->Setter)
            {
                RecyclableObject* func = VarTo<RecyclableObject>(descriptor->Setter);
                // TODO : request context
                JavascriptOperators::CallSetter(func, instance, value, NULL);
            }

            return true;
        }

        //
        // Not found in attribute map. Extend or update data item.
        //
        if (!(this->GetFlags() & this->IsExtensibleFlag))
        {
            if (!HasDataItem(arr, index))
            {
                return CantExtend(flags, scriptContext);
            }
            else if (!(GetDataItemAttributes() & PropertyWritable))
            {
                return CantAssign(flags, scriptContext);
            }
        }

        // No need to change hasNoEnumerableProperties. See comment in ES5ArrayTypeHandlerBase<T>::SetItemWithAttributes.
        Assert(!arr->GetHasNoEnumerableProperties());

        arr->DirectSetItemAt(index, value); // sharing data item attributes
        return true;
    }